

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

size_t __thiscall
zmq::mechanism_t::add_basic_properties(mechanism_t *this,uchar *ptr_,size_t ptr_capacity_)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  uchar *ptr__00;
  
  pcVar1 = socket_type_string((int)(this->options).type);
  sVar2 = strlen(pcVar1);
  sVar3 = add_property(ptr_,ptr_capacity_,"Socket-Type",pcVar1,sVar2);
  ptr__00 = ptr_ + sVar3;
  uVar5 = (uint)(byte)(this->options).type;
  if ((uVar5 < 7) && ((0x68U >> (uVar5 & 0x1f) & 1) != 0)) {
    sVar3 = add_property(ptr__00,ptr_capacity_ - sVar3,"Identity",(this->options).routing_id,
                         (ulong)(this->options).routing_id_size);
    ptr__00 = ptr__00 + sVar3;
  }
  for (p_Var4 = (this->options).app_metadata._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->options).app_metadata._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pcVar1 = *(char **)((long)p_Var4 + 0x20);
    __s = *(char **)((long)p_Var4 + 0x40);
    sVar2 = strlen(__s);
    sVar3 = add_property(ptr__00,(size_t)(ptr_ + (ptr_capacity_ - (long)ptr__00)),pcVar1,__s,sVar2);
    ptr__00 = (uchar *)((long)ptr__00 + sVar3);
  }
  return (long)ptr__00 - (long)ptr_;
}

Assistant:

size_t zmq::mechanism_t::add_basic_properties (unsigned char *ptr_,
                                               size_t ptr_capacity_) const
{
    unsigned char *ptr = ptr_;

    //  Add socket type property
    const char *socket_type = socket_type_string (options.type);
    ptr += add_property (ptr, ptr_capacity_, ZMTP_PROPERTY_SOCKET_TYPE,
                         socket_type, strlen (socket_type));

    //  Add identity (aka routing id) property
    if (options.type == ZMQ_REQ || options.type == ZMQ_DEALER
        || options.type == ZMQ_ROUTER) {
        ptr += add_property (ptr, ptr_capacity_ - (ptr - ptr_),
                             ZMTP_PROPERTY_IDENTITY, options.routing_id,
                             options.routing_id_size);
    }


    for (std::map<std::string, std::string>::const_iterator
           it = options.app_metadata.begin (),
           end = options.app_metadata.end ();
         it != end; ++it) {
        ptr +=
          add_property (ptr, ptr_capacity_ - (ptr - ptr_), it->first.c_str (),
                        it->second.c_str (), strlen (it->second.c_str ()));
    }

    return ptr - ptr_;
}